

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

string * __thiscall
helics::CommonCore::getInjectionUnits_abi_cxx11_(CommonCore *this,InterfaceHandle handle)

{
  char cVar1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar2;
  FederateState *pFVar3;
  InputInfo *this_00;
  string *psVar4;
  
  ppVar2 = getHandleInfo(this,handle);
  if (ppVar2 != (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0) {
    cVar1 = *(char *)((long)&(ppVar2->first)._M_string_length + 4);
    if (cVar1 == 'p') {
      return (string *)&ppVar2[1].first.field_2;
    }
    if (cVar1 == 'i') {
      pFVar3 = getFederateAt(this,(LocalFederateId)(BaseType)(ppVar2->first)._M_string_length);
      this_00 = InterfaceInfo::getInput(&pFVar3->interfaceInformation,handle);
      if (this_00 != (InputInfo *)0x0) {
        psVar4 = InputInfo::getInjectionUnits_abi_cxx11_(this_00);
        return psVar4;
      }
    }
  }
  return (string *)&gEmptyString_abi_cxx11_;
}

Assistant:

const std::string& CommonCore::getInjectionUnits(InterfaceHandle handle) const
{
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo != nullptr) {
        switch (handleInfo->handleType) {
            case InterfaceType::INPUT: {
                auto* fed = getFederateAt(handleInfo->local_fed_id);
                auto* inpInfo = fed->interfaces().getInput(handle);
                if (inpInfo != nullptr) {
                    return inpInfo->getInjectionUnits();
                }
                break;
            }
            case InterfaceType::PUBLICATION:
                return handleInfo->units;
            default:
                return gEmptyString;
        }
    }
    return gEmptyString;
}